

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  int extraout_EAX;
  TextureWrapCase *pTVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  anon_struct_16_2_3f8b7511 *paVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  allocator<char> local_1c1;
  anon_struct_16_2_3f8b7511 *local_1c0;
  ulong local_1b8;
  anon_struct_16_2_3f8b7511 *local_1b0;
  anon_struct_16_2_3f8b7511 *local_1a8;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    local_1b8 = (ulong)init::wrapModes[lVar7].mode;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      iVar10 = (int)local_1b8;
      local_1a8 = (anon_struct_16_2_3f8b7511 *)
                  CONCAT71(local_1a8._1_7_,lVar6 != 2 || iVar10 != 0x2901);
      local_1b0 = init::wrapModes + lVar6;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        local_1c0 = init::filteringModes + lVar5;
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          lVar11 = 0;
          while( true ) {
            if (lVar11 == 0x40) break;
            if ((((lVar6 != 0 || iVar10 != 0x812f) & lVar11 != 0 & (byte)local_1a8) == 0) &&
               ((lVar6 == 0 && iVar10 == 0x812f ||
                (((init::sizes[lVar4].width & init::sizes[lVar4].width - 1U) == 0 &&
                 ((init::sizes[lVar4].height & init::sizes[lVar4].height - 1U) == 0)))))) {
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_1c1);
              std::operator+(&local_70,&local_90,init::wrapModes[lVar7].name);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &potFilenames,&local_70,"_");
              std::operator+(&local_b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &potFilenames,local_1b0->name);
              std::operator+(&local_50,&local_b0,"_");
              std::operator+(&local_d0,&local_50,local_1c0->name);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &npotFilenames,&local_d0,"_");
              std::operator+(&local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &npotFilenames,init::sizes[lVar4].name);
              std::operator+(&local_110,&local_f0,"_");
              std::operator+(&name,&local_110,*(char **)((long)&init::formats[0].name + lVar11));
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&npotFilenames);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&potFilenames);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_90);
              pTVar3 = (TextureWrapCase *)operator_new(0x118);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              TextureWrapCase::TextureWrapCase
                        (pTVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                         name._M_dataplus._M_p,"",
                         *(deUint32 *)((long)&init::formats[0].format + lVar11),
                         *(deUint32 *)((long)&init::formats[0].dataType + lVar11),
                         (deUint32)local_1b8,local_1b0->mode,local_1c0->mode,local_1c0->mode,
                         init::sizes[lVar4].width,init::sizes[lVar4].height);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
              std::__cxx11::string::~string((string *)&name);
            }
            lVar11 = lVar11 + 0x10;
          }
        }
      }
    }
  }
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"data/etc1/photo_helsinki_mip_0.pkm",(allocator<char> *)&local_110);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
             &name);
  std::__cxx11::string::~string((string *)&name);
  uVar9 = 0;
  while (uVar9 != 3) {
    local_1c0 = init::wrapModes + uVar9;
    paVar8 = (anon_struct_16_2_3f8b7511 *)0x0;
    local_1b8 = uVar9;
    while (paVar8 != (anon_struct_16_2_3f8b7511 *)0x3) {
      local_1a8 = init::wrapModes + (long)paVar8;
      lVar7 = 0;
      local_1b0 = paVar8;
      while( true ) {
        if (lVar7 == 0x20) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"",(allocator<char> *)&local_70);
        std::operator+(&local_50,&local_b0,local_1c0->name);
        std::operator+(&local_d0,&local_50,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &npotFilenames,&local_d0,local_1a8->name);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &npotFilenames,"_");
        std::operator+(&local_110,&local_f0,*(char **)((long)&init::filteringModes[0].name + lVar7))
        ;
        std::operator+(&name,&local_110,"_pot_etc1");
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&npotFilenames);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        pTVar3 = (TextureWrapCase *)operator_new(0x118);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar7);
        TextureWrapCase::TextureWrapCase
                  (pTVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar2->m_renderCtx,pCVar2->m_contextInfo,name._M_dataplus._M_p,"",
                   local_1c0->mode,local_1a8->mode,dVar1,dVar1,&potFilenames);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
        std::__cxx11::string::~string((string *)&name);
        lVar7 = lVar7 + 0x10;
      }
      paVar8 = (anon_struct_16_2_3f8b7511 *)((long)&local_1b0->name + 1);
    }
    uVar9 = local_1b8 + 1;
  }
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"data/etc1/photo_helsinki_113x89.pkm",(allocator<char> *)&local_110);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
             &name);
  std::__cxx11::string::~string((string *)&name);
  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"clamp_clamp_",(allocator<char> *)&local_d0);
    std::operator+(&local_110,&local_f0,*(char **)((long)&init::filteringModes[0].name + lVar7));
    std::operator+(&name,&local_110,"_npot_etc1");
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    pTVar3 = (TextureWrapCase *)operator_new(0x118);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar7);
    TextureWrapCase::TextureWrapCase
              (pTVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pCVar2->m_renderCtx,pCVar2->m_contextInfo,name._M_dataplus._M_p,"",0x812f,0x812f,
               dVar1,dVar1,&npotFilenames);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  return extraout_EAX;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes[] =
	{
		{ "pot",		64, 128 },
		{ "npot",		63, 112 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
	FOR_EACH(size,		sizes,
	FOR_EACH(format,	formats,
		{
			bool is_clamp_clamp		= (wrapModes[wrapS].mode == GL_CLAMP_TO_EDGE	&& wrapModes[wrapT].mode == GL_CLAMP_TO_EDGE);
			bool is_repeat_mirror	= (wrapModes[wrapS].mode == GL_REPEAT			&& wrapModes[wrapT].mode == GL_MIRRORED_REPEAT);

			if (!is_clamp_clamp && !is_repeat_mirror && format != 0)
				continue; // Use other format varants with clamp_clamp & repeat_mirror pair only.

			if (!is_clamp_clamp && (!deIsPowerOfTwo32(sizes[size].width) || !deIsPowerOfTwo32(sizes[size].height)))
				continue; // Not supported as described in Spec section 3.8.2.

			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + sizes[size].name + "_" + formats[format].name;
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 formats[format].format, formats[format].dataType,
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 sizes[size].width, sizes[size].height));

		})))));

	// Power-of-two ETC1 texture
	std::vector<std::string> potFilenames;
	potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

	FOR_EACH(wrapS,		wrapModes,
	FOR_EACH(wrapT,		wrapModes,
	FOR_EACH(filter,	filteringModes,
		{
			string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot_etc1";
			addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
										 wrapModes[wrapS].mode,
										 wrapModes[wrapT].mode,
										 filteringModes[filter].mode, filteringModes[filter].mode,
										 potFilenames));

		})));

	std::vector<std::string> npotFilenames;
	npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

	// NPOT ETC1 texture
	for (int filter = 0; filter < DE_LENGTH_OF_ARRAY(filteringModes); filter++)
	{
		string name = string("clamp_clamp_") + filteringModes[filter].name + "_npot_etc1";
		addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
									 GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE,
									 filteringModes[filter].mode, filteringModes[filter].mode,
									 npotFilenames));
	}
}